

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O3

ptr<Value> __thiscall Environment::getValue(Environment *this,Identifier *ident)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ptr<Member> pVar2;
  undefined1 auVar3 [16];
  ptr<Value> pVar4;
  __buckets_ptr local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  pVar2 = getMember((Environment *)&stack0xffffffffffffffe0,ident);
  _Var1 = pVar2.super___shared_ptr<Member,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_20 != (__buckets_ptr)0x0) {
    auVar3 = __dynamic_cast(local_20,&Member::typeinfo,&Value::typeinfo,0);
    _Var1._M_pi = auVar3._8_8_;
    if (auVar3._0_8_ != (__buckets_ptr)0x0) {
      (this->symbols)._M_h._M_buckets = auVar3._0_8_;
      (this->symbols)._M_h._M_bucket_count = (size_type)local_18;
      if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_18->_M_use_count = local_18->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_18->_M_use_count = local_18->_M_use_count + 1;
        }
      }
      goto LAB_0011b2c5;
    }
  }
  (this->symbols)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->symbols)._M_h._M_bucket_count = 0;
LAB_0011b2c5:
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    _Var1._M_pi = extraout_RDX;
  }
  pVar4.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  pVar4.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar4.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> Environment::getValue(const Identifier &ident) {
    return std::dynamic_pointer_cast<Value>(getMember(ident));
}